

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O1

void __thiscall
asio::detail::reactive_socket_service_base::
start_accept_op<asio::detail::reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,asio::any_io_executor>,asio::ip::tcp,std::function<void(std::error_code_const&)>,asio::any_io_executor>>
          (reactive_socket_service_base *this,base_implementation_type *impl,
          reactive_socket_accept_op<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp,_std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
          *op,bool is_continuation,bool peer_is_open,void *param_5,
          enable_if_t<is_same<typename_associated_immediate_executor<typename_reactive_socket_accept_op<basic_socket<tcp>,_tcp,_function<void_(const_error_code_&)>,_any_io_executor>::handler_type,_typename_reactive_socket_accept_op<basic_socket<tcp>,_tcp,_function<void_(const_error_code_&)>,_any_io_executor>::io_executor_type>::asio_associated_immediate_executor_is_unspecialised,_void>::value>
          *param_6)

{
  atomic_count *paVar1;
  int __fd;
  reactor *prVar2;
  per_descriptor_data pdVar3;
  reactor *prVar4;
  per_descriptor_data pdVar5;
  reactor_op *prVar6;
  bool bVar7;
  status sVar8;
  reactor_op *prVar9;
  undefined3 in_register_00000081;
  epoll_event local_40;
  
  prVar2 = this->reactor_;
  if (CONCAT31(in_register_00000081,peer_is_open) != 0) {
    std::error_code::operator=
              (&(op->
                super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
                ).super_reactor_op.ec_,already_open);
LAB_0042c69c:
    scheduler::post_immediate_completion(prVar2->scheduler_,(operation *)op,is_continuation);
    return;
  }
  if (((impl->state_ & 3) == 0) &&
     (bVar7 = socket_ops::set_internal_non_blocking
                        (impl->socket_,&impl->state_,true,
                         &(op->
                          super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
                          ).super_reactor_op.ec_), !bVar7)) goto LAB_0042c69c;
  pdVar3 = impl->reactor_data_;
  if (pdVar3 == (per_descriptor_data)0x0) {
    std::error_code::operator=
              (&(op->
                super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
                ).super_reactor_op.ec_,bad_descriptor);
    goto LAB_0042c69c;
  }
  prVar4 = this->reactor_;
  __fd = impl->socket_;
  bVar7 = (pdVar3->mutex_).enabled_ == true;
  if (bVar7) {
    pthread_mutex_lock((pthread_mutex_t *)&(pdVar3->mutex_).mutex_);
  }
  pdVar5 = impl->reactor_data_;
  if (pdVar5->shutdown_ == false) {
    if (pdVar5->op_queue_[0].front_ == (reactor_op *)0x0) {
      if (pdVar5->op_queue_[2].front_ == (reactor_op *)0x0) {
        if ((pdVar5->try_speculative_[0] == true) &&
           (sVar8 = (*(op->
                      super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
                      ).super_reactor_op.perform_func_)((reactor_op *)op), sVar8 != not_done)) {
          if ((sVar8 == done_and_exhausted) && (impl->reactor_data_->registered_events_ != 0)) {
            impl->reactor_data_->try_speculative_[0] = false;
          }
          if (bVar7) {
            if ((pdVar3->mutex_).enabled_ == true) {
              pthread_mutex_unlock((pthread_mutex_t *)&(pdVar3->mutex_).mutex_);
            }
            bVar7 = false;
          }
          scheduler::post_immediate_completion(prVar2->scheduler_,(operation *)op,is_continuation);
          goto LAB_0042c721;
        }
        if (impl->reactor_data_->registered_events_ == 0) goto LAB_0042c7f6;
      }
      else {
        if (pdVar5->registered_events_ == 0) {
LAB_0042c7f6:
          std::error_code::operator=
                    (&(op->
                      super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
                      ).super_reactor_op.ec_,operation_not_supported);
          goto LAB_0042c6cf;
        }
        local_40._4_4_ = SUB84(pdVar5,0);
        local_40.data.fd = (int)((ulong)pdVar5 >> 0x20);
        local_40.events = pdVar5->registered_events_;
        epoll_ctl(prVar4->epoll_fd_,3,__fd,&local_40);
      }
    }
    pdVar5 = impl->reactor_data_;
    (op->
    super_reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
    ).super_reactor_op.super_operation.next_ = (scheduler_operation *)0x0;
    prVar6 = pdVar5->op_queue_[0].back_;
    prVar9 = (reactor_op *)&pdVar5->op_queue_[0].back_;
    if (prVar6 != (reactor_op *)0x0) {
      prVar9 = prVar6;
    }
    (prVar9->super_operation).next_ = (scheduler_operation *)op;
    (&pdVar5->op_queue_[0].front_)[prVar6 != (reactor_op *)0x0] = (reactor_op *)op;
    LOCK();
    paVar1 = &prVar4->scheduler_->outstanding_work_;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  else {
LAB_0042c6cf:
    scheduler::post_immediate_completion(prVar2->scheduler_,(operation *)op,is_continuation);
  }
LAB_0042c721:
  if (bVar7) {
    pthread_mutex_unlock((pthread_mutex_t *)&(pdVar3->mutex_).mutex_);
  }
  return;
}

Assistant:

void start_accept_op(base_implementation_type& impl, Op* op,
      bool is_continuation, bool peer_is_open, const void*,
      enable_if_t<
        is_same<
          typename associated_immediate_executor<
            typename Op::handler_type,
            typename Op::io_executor_type
          >::asio_associated_immediate_executor_is_unspecialised,
          void
        >::value
      >*)
  {
    return do_start_accept_op(impl, op, is_continuation, peer_is_open,
        &reactor::call_post_immediate_completion, &reactor_);
  }